

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alternate_shared_mutex.hpp
# Opt level: O3

bool __thiscall
yamc::alternate::detail::shared_mutex_base<yamc::rwlock::WriterPrefer>::try_lock_shared
          (shared_mutex_base<yamc::rwlock::WriterPrefer> *this)

{
  size_t *psVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx_);
  if (iVar3 == 0) {
    sVar2 = (this->state_).nwriter;
    if (sVar2 == 0) {
      psVar1 = &(this->state_).nreader;
      *psVar1 = *psVar1 + 1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->mtx_);
    return sVar2 == 0;
  }
  std::__throw_system_error(iVar3);
}

Assistant:

bool try_lock_shared()
  {
    std::lock_guard<decltype(mtx_)> lk(mtx_);
    if (RwLockPolicy::wait_rlock(state_))
      return false;
    RwLockPolicy::acquire_rlock(state_);
    return true;
  }